

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

op_t * force_val(op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,op_t op,int arr_p)

{
  MIR_context_t ctx;
  int iVar1;
  MIR_insn_t_conflict pMVar2;
  MIR_insn_code_t code;
  op_t local_d8 [2];
  
  ctx = c2m_ctx->ctx;
  if ((arr_p == 0) || (op.mir_op._8_1_ != '\n')) {
    if ((op.decl == (decl_t)0x0) || ((op.decl)->bit_offset < 0)) {
      local_d8[0].mir_op._8_8_ = op.mir_op._8_8_;
      local_d8[0].decl = op.decl;
      local_d8[0]._8_8_ = op._8_8_;
      local_d8[0].mir_op.data = op.mir_op.data;
      local_d8[0].mir_op.u.i = op.mir_op.u.i;
      local_d8[0].mir_op.u.str.s = op.mir_op.u.str.s;
      local_d8[0].mir_op.u._16_8_ = op.mir_op.u._16_8_;
      local_d8[0].mir_op.u.mem.disp = op.mir_op.u.mem.disp;
    }
    else {
      if (op.mir_op._8_1_ != '\n') {
        __assert_fail("op.mir_op.mode == MIR_OP_MEM",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2a16,"op_t force_val(c2m_ctx_t, op_t, int)");
      }
      get_new_temp(local_d8,c2m_ctx,MIR_T_I64);
      pMVar2 = MIR_new_insn(c2m_ctx->ctx,MIR_MOV);
      emit_insn_opt(c2m_ctx,pMVar2);
      iVar1 = (op.decl)->width + (op.decl)->bit_offset;
      if (iVar1 != 0x40) {
        MIR_new_int_op(ctx,(long)(0x40 - iVar1));
        pMVar2 = MIR_new_insn(c2m_ctx->ctx,MIR_LSH);
        emit_insn_opt(c2m_ctx,pMVar2);
      }
      iVar1 = signed_integer_type_p(((op.decl)->decl_spec).type);
      if (iVar1 == 0) {
        iVar1 = (op.decl)->width;
        code = MIR_URSH;
      }
      else {
        iVar1 = (op.decl)->width;
        if ((((op.decl)->decl_spec).type)->mode == TM_ENUM) {
          code = (iVar1 < 0x20) + 0x44 + (uint)(iVar1 < 0x20);
        }
        else {
          code = MIR_RSH;
        }
      }
      MIR_new_int_op(ctx,(long)(0x40 - iVar1));
      pMVar2 = MIR_new_insn(c2m_ctx->ctx,code);
      emit_insn_opt(c2m_ctx,pMVar2);
    }
    __return_storage_ptr__->decl = local_d8[0].decl;
    *(undefined8 *)&__return_storage_ptr__->field_0x8 = local_d8[0]._8_8_;
    (__return_storage_ptr__->mir_op).data = local_d8[0].mir_op.data;
    *(undefined8 *)&(__return_storage_ptr__->mir_op).field_0x8 = local_d8[0].mir_op._8_8_;
    (__return_storage_ptr__->mir_op).u.i = local_d8[0].mir_op.u._0_8_;
    (__return_storage_ptr__->mir_op).u.str.s = (char *)local_d8[0].mir_op.u._8_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->mir_op).u + 0x10) = local_d8[0].mir_op.u._16_8_;
    (__return_storage_ptr__->mir_op).u.mem.disp = local_d8[0].mir_op.u._24_8_;
  }
  else {
    mem_to_address(__return_storage_ptr__,c2m_ctx,op,0);
  }
  return __return_storage_ptr__;
}

Assistant:

static op_t force_val (c2m_ctx_t c2m_ctx, op_t op, int arr_p) {
  MIR_context_t ctx = c2m_ctx->ctx;
  op_t temp_op;
  int sh;

  if (arr_p && op.mir_op.mode == MIR_OP_MEM) {
    /* an array -- use a pointer: */
    return mem_to_address (c2m_ctx, op, FALSE);
  }
  if (op.decl == NULL || op.decl->bit_offset < 0) return op;
  assert (op.mir_op.mode == MIR_OP_MEM);
  temp_op = get_new_temp (c2m_ctx, MIR_T_I64);
  emit2 (c2m_ctx, MIR_MOV, temp_op.mir_op, op.mir_op); /* ??? */
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
  sh = 64 - op.decl->bit_offset - op.decl->width;
#else
  sh = op.decl->bit_offset + (64 - type_size (c2m_ctx, op.decl->decl_spec.type) * MIR_CHAR_BIT);
#endif
  if (sh != 0) emit3 (c2m_ctx, MIR_LSH, temp_op.mir_op, temp_op.mir_op, MIR_new_int_op (ctx, sh));
  emit3 (c2m_ctx,
         signed_integer_type_p (op.decl->decl_spec.type)
             && (op.decl->decl_spec.type->mode != TM_ENUM
                 || op.decl->width >= (int) sizeof (mir_int) * MIR_CHAR_BIT)
           ? MIR_RSH
           : MIR_URSH,
         temp_op.mir_op, temp_op.mir_op, MIR_new_int_op (ctx, 64 - op.decl->width));
  return temp_op;
}